

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O2

void __thiscall
Js::CompoundString::CompoundString
          (CompoundString *this,CharCount stringLength,CharCount directCharLength,void *buffer,
          CharCount usedCharLength,bool reserveMoreSpace,JavascriptLibrary *library)

{
  code *pcVar1;
  bool bVar2;
  StaticType *type;
  undefined4 *puVar3;
  Block *ptr;
  
  type = StringCache::GetStringTypeStatic(&library->stringCache);
  LiteralString::LiteralString(&this->super_LiteralString,type);
  (this->super_LiteralString).super_JavascriptString.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_0138ed08;
  BlockInfo::BlockInfo(&this->lastBlockInfo);
  this->directCharLength = directCharLength;
  this->ownsLastBlock = true;
  (this->lastBlock).ptr = (Block *)0x0;
  if (stringLength < directCharLength && directCharLength != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x1ec,
                                "(directCharLength == static_cast<CharCount>(-1) || directCharLength <= stringLength)"
                                ,
                                "directCharLength == static_cast<CharCount>(-1) || directCharLength <= stringLength"
                               );
    if (!bVar2) goto LAB_00a07cfe;
    *puVar3 = 0;
  }
  if (buffer == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x1ed,"(buffer)","buffer");
    if (!bVar2) {
LAB_00a07cfe:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  JavascriptString::SetLength((JavascriptString *)this,stringLength);
  ptr = BlockInfo::CopyBuffer
                  (&this->lastBlockInfo,buffer,usedCharLength,reserveMoreSpace,library->recycler);
  Memory::WriteBarrierPtr<Js::CompoundString::Block>::WriteBarrierSet(&this->lastBlock,ptr);
  return;
}

Assistant:

CompoundString::CompoundString(
        const CharCount stringLength,
        const CharCount directCharLength,
        const void *const buffer,
        const CharCount usedCharLength,
        const bool reserveMoreSpace,
        JavascriptLibrary *const library)
        : LiteralString(library->GetStringTypeStatic()),
        directCharLength(directCharLength),
        ownsLastBlock(true)
    {
        Assert(directCharLength == static_cast<CharCount>(-1) || directCharLength <= stringLength);
        Assert(buffer);
        Assert(library);

        SetLength(stringLength);
        lastBlock = lastBlockInfo.CopyBuffer(buffer, usedCharLength, reserveMoreSpace, library->GetRecycler());
    }